

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypergeometric_dist.hpp
# Opt level: O2

double __thiscall trng::hypergeometric_dist::pdf(hypergeometric_dist *this,int x)

{
  pointer pdVar1;
  int iVar2;
  double dVar3;
  
  iVar2 = (this->P).x_min;
  dVar3 = 0.0;
  if ((iVar2 <= x) && (x <= (this->P).x_max)) {
    iVar2 = x - iVar2;
    if (iVar2 == 0) {
      return *(this->P).P_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    }
    pdVar1 = (this->P).P_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar3 = pdVar1[iVar2] - pdVar1[(long)iVar2 + -1];
  }
  return dVar3;
}

Assistant:

double pdf(int x) const {
      if (x < P.x_min or x > P.x_max)
        return 0.0;
      x -= P.x_min;
      if (x == 0)
        return P.P_[0];
      return P.P_[x] - P.P_[x - 1];
    }